

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qprocess.cpp
# Opt level: O0

void __thiscall QProcess::setUnixProcessParameters(QProcess *this,UnixProcessParameters *params)

{
  undefined8 uVar1;
  bool bVar2;
  pointer pUVar3;
  undefined8 *in_RSI;
  QProcessPrivate *d;
  pointer in_stack_ffffffffffffffc8;
  UnixExtras *in_stack_ffffffffffffffd0;
  
  d_func((QProcess *)0x7910ec);
  bVar2 = std::unique_ptr::operator_cast_to_bool
                    ((unique_ptr<QProcessPrivate::UnixExtras,_std::default_delete<QProcessPrivate::UnixExtras>_>
                      *)0x791102);
  if (!bVar2) {
    operator_new(0x40);
    QProcessPrivate::UnixExtras::UnixExtras(in_stack_ffffffffffffffd0);
    std::unique_ptr<QProcessPrivate::UnixExtras,_std::default_delete<QProcessPrivate::UnixExtras>_>
    ::reset((unique_ptr<QProcessPrivate::UnixExtras,_std::default_delete<QProcessPrivate::UnixExtras>_>
             *)in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  }
  pUVar3 = std::
           unique_ptr<QProcessPrivate::UnixExtras,_std::default_delete<QProcessPrivate::UnixExtras>_>
           ::operator->((unique_ptr<QProcessPrivate::UnixExtras,_std::default_delete<QProcessPrivate::UnixExtras>_>
                         *)0x791157);
  uVar1 = *in_RSI;
  (pUVar3->processParameters).flags = (UnixProcessFlags)(int)uVar1;
  (pUVar3->processParameters).lowestFileDescriptorToClose = (int)((ulong)uVar1 >> 0x20);
  *(undefined8 *)(pUVar3->processParameters)._reserved = in_RSI[1];
  *(undefined8 *)((pUVar3->processParameters)._reserved + 2) = in_RSI[2];
  *(undefined8 *)((pUVar3->processParameters)._reserved + 4) = in_RSI[3];
  return;
}

Assistant:

void QProcess::setUnixProcessParameters(const UnixProcessParameters &params)
{
    Q_D(QProcess);
    if (!d->unixExtras)
        d->unixExtras.reset(new QProcessPrivate::UnixExtras);
    d->unixExtras->processParameters = params;
}